

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenStreamIOException.hpp
# Opt level: O0

void __thiscall
antlr::TokenStreamIOException::TokenStreamIOException(TokenStreamIOException *this,exception *e)

{
  exception *in_RSI;
  TokenStreamException *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  (**(code **)(*(long *)in_RSI + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  TokenStreamException::TokenStreamException(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  (in_RDI->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__TokenStreamIOException_0033e6d8;
  std::exception::exception((exception *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

TokenStreamIOException(const ANTLR_USE_NAMESPACE(std)exception& e)
	: TokenStreamException(e.what())
	, io(e)
	{
	}